

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

VariableP<tcu::Matrix<float,_4,_3>_> __thiscall
deqp::gls::BuiltinPrecisionTests::variable<tcu::Matrix<float,4,3>>
          (BuiltinPrecisionTests *this,string *name)

{
  Variable<tcu::Matrix<float,_4,_3>_> *this_00;
  SharedPtrStateBase *extraout_RDX;
  VariableP<tcu::Matrix<float,_4,_3>_> VVar1;
  
  this_00 = (Variable<tcu::Matrix<float,_4,_3>_> *)operator_new(0x28);
  Variable<tcu::Matrix<float,_4,_3>_>::Variable(this_00,name);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>::
  SharedPtr((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
             *)this,this_00);
  VVar1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>.
  m_state = extraout_RDX;
  VVar1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>.
  m_ptr = (Variable<tcu::Matrix<float,_4,_3>_> *)this;
  return (VariableP<tcu::Matrix<float,_4,_3>_>)
         VVar1.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
  ;
}

Assistant:

VariableP<T> variable (const string& name)
{
	return VariableP<T>(new Variable<T>(name));
}